

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> __first;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> __last;
  long lVar1;
  action aVar2;
  bool bVar3;
  bool bVar4;
  undefined2 uVar5;
  pointer pbVar6;
  undefined4 __seed;
  int iVar7;
  times *ptVar8;
  confirm *pcVar9;
  ulong uVar10;
  tms *__buffer;
  int in_R8D;
  texts in;
  rng generator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [5];
  bool bStack_1a3;
  bool bStack_1a2;
  bool bStack_1a1;
  pointer local_1a0;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  _Alloc_hider local_180;
  size_t local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  pointer local_160;
  pointer pbStack_158;
  pointer local_150;
  undefined8 uStack_148;
  tests local_138;
  vector<lest::test,_std::allocator<lest::test>_> local_120;
  undefined1 local_108 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_f0;
  tests local_d8;
  vector<lest::test,_std::allocator<lest::test>_> local_c0;
  tests local_a8;
  vector<lest::test,_std::allocator<lest::test>_> local_90;
  tests local_78;
  vector<lest::test,_std::allocator<lest::test>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,arguments);
  split_arguments((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1a8,&local_48);
  __seed = local_198._0_4_;
  pbVar6 = local_1a0;
  aVar2.os = _local_1a8;
  bVar3 = local_1a8[4];
  bVar4 = bStack_1a3;
  uVar5 = _bStack_1a2;
  pcVar9 = (confirm *)((ulong)local_1a0 >> 0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_1c8,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_198 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_198 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (((ulong)pbVar6 & 1) != 0) {
    __first._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar10 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x3333333333333333;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(lest::test_const&,lest::test_const&)>>
                (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_lest::test_&,_const_lest::test_&)>)0x10cef1);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(lest::test_const&,lest::test_const&)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_lest::test_&,_const_lest::test_&)>)0x10cef1);
    }
  }
  if (((ulong)pbVar6 & 0x100) != 0) {
    srand(__seed);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,lest::rng>
              ((specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
               super__Vector_impl_data._M_finish,(rng *)local_1a8);
  }
  if (((ulong)aVar2.os & 1) == 0) {
    if (((ulong)pbVar6 & 0x1000000) == 0) {
      if (((ulong)aVar2.os & 0x10000) == 0) {
        if (((ulong)aVar2.os & 0x1000000) == 0) {
          if (((ulong)aVar2.os & 0x100000000) == 0) {
            if (((ulong)aVar2.os & 0x10000000000) == 0) {
              local_180._M_p = (pointer)&local_170;
              local_198._0_4_ = SUB84(aVar2.os,0);
              local_198[4] = bVar3;
              local_198[5] = bVar4;
              bStack_1a2 = SUB21(uVar5,0);
              bStack_1a1 = SUB21(uVar5,1);
              local_198[6] = bStack_1a2;
              local_198[7] = bStack_1a1;
              local_198._8_8_ = pbVar6;
              local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_188._4_4_,__seed);
              local_178 = 0;
              local_170._M_local_buf[0] = '\0';
              local_160 = (pointer)0x0;
              pbStack_158 = (pointer)0x0;
              local_150 = (pointer)0x0;
              uStack_148._0_4_ = 0;
              uStack_148._4_4_ = 0;
              _local_1a8 = os;
              local_1a0 = (pointer)os;
              std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_120,specification)
              ;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_138,&local_1c8);
              pcVar9 = for_test<lest::confirm>
                                 ((lest *)&local_120,&local_138,(texts *)local_1a8,pcVar9,in_R8D);
              iVar7 = pcVar9->failures;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_138);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_120);
              confirm::~confirm((confirm *)local_1a8);
            }
            else {
              times::times((times *)local_1a8,(tms *)os);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_f0,specification);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_108,&local_1c8);
              __buffer = (tms *)local_108;
              ptVar8 = for_test<lest::times>
                                 ((lest *)&local_f0,(tests *)__buffer,(texts *)local_1a8,
                                  (times *)0x1,in_R8D);
              iVar7 = ptVar8->failures;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_108);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_f0);
              times::~times((times *)local_1a8,__buffer);
            }
            goto LAB_00109ab5;
          }
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198;
          local_198._0_4_ = 0;
          local_198._8_8_ = (pointer)0x0;
          local_178 = 0;
          _local_1a8 = os;
          local_180._M_p = (pointer)local_188;
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_c0,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_d8,&local_1c8);
          for_test<lest::ptags>((lest *)&local_c0,&local_d8,(texts *)local_1a8,(ptags *)0x1,in_R8D);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d8);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_c0);
          ptags::~ptags((ptags *)local_1a8);
        }
        else {
          _local_1a8 = os;
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_90,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a8,&local_1c8);
          for_test<lest::print>((lest *)&local_90,&local_a8,(texts *)local_1a8,(print *)0x1,in_R8D);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_90);
        }
      }
      else {
        local_1a0 = (pointer)((ulong)local_1a0 & 0xffffffff00000000);
        _local_1a8 = os;
        std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_60,specification);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_78,&local_1c8);
        for_test<lest::count>((lest *)&local_60,&local_78,(texts *)local_1a8,(count *)0x1,in_R8D);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_78);
        std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_60);
        count::~count((count *)local_1a8);
      }
      iVar7 = 0;
    }
    else {
      iVar7 = version(os);
    }
  }
  else {
    iVar7 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "\nUsage: test [options] [test-spec ...]\n\nOptions:\n  -h, --help         this help message\n  -a, --abort        abort at first failure\n  -c, --count        count selected tests\n  -g, --list-tags    list tags of selected tests\n  -l, --list-tests   list selected tests\n  -p, --pass         also report passing tests\n  -z, --pass-zen     ... without expansion\n  -t, --time         list duration of selected tests\n  -v, --verbose      also report passing or failing sections\n  --order=declared   use source code test order (default)\n  --order=lexical    use lexical sort test order\n  --order=random     use random test order\n  --random-seed=n    use n for random generator seed\n  --random-seed=time use time for random generator seed\n  --repeat=n         repeat selected tests n times (-1: indefinite)\n  --version          report lest version and compiler used\n  --                 end options\n\nTest specification:\n  \"@\", \"*\" all tests, unless excluded\n  empty    all tests, unless tagged [hide] or [.optional-name]\n  \"text\"   select tests that contain text (case insensitive)\n  \"!text\"  omit tests that contain text (case insensitive)\n"
               ,0x469);
  }
LAB_00109ab5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return iVar7;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage  ( os ); }
        if ( option.version ) { return version( os ); }
        if ( option.count   ) { count count_( os         ); return for_test( specification, in, count_ ); }
        if ( option.list    ) { print print_( os         ); return for_test( specification, in, print_ ); }
        if ( option.tags    ) { ptags ptags_( os         ); return for_test( specification, in, ptags_ ); }
        if ( option.time    ) { times times_( os, option ); return for_test( specification, in, times_ ); }

        { confirm confirm_( os, option ); return for_test( specification, in, confirm_, option.repeat ); }
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}